

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

void pushstr(BuffFS *buff,char *str,size_t lstr)

{
  lua_State *L_00;
  StkId pSVar1;
  TString *pTVar2;
  TString *x_;
  TValue *io;
  lua_State *L;
  size_t lstr_local;
  char *str_local;
  BuffFS *buff_local;
  
  L_00 = buff->L;
  pSVar1 = (L_00->top).p;
  pTVar2 = luaS_newlstr(L_00,str,lstr);
  *(TString **)pSVar1 = pTVar2;
  (pSVar1->val).tt_ = pTVar2->tt | 0x40;
  (L_00->top).p = (StkId)((L_00->top).offset + 0x10);
  if (buff->pushed == 0) {
    buff->pushed = 1;
  }
  else {
    luaV_concat(L_00,2);
  }
  return;
}

Assistant:

static void pushstr (BuffFS *buff, const char *str, size_t lstr) {
  lua_State *L = buff->L;
  setsvalue2s(L, L->top.p, luaS_newlstr(L, str, lstr));
  L->top.p++;  /* may use one slot from EXTRA_STACK */
  if (!buff->pushed)  /* no previous string on the stack? */
    buff->pushed = 1;  /* now there is one */
  else  /* join previous string with new one */
    luaV_concat(L, 2);
}